

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_transpose(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *tensor;
  
  tensor = ggml_view_tensor(ctx,a);
  ggml_format_name(tensor,"%s (transposed)",a->name);
  tensor->ne[0] = a->ne[1];
  tensor->ne[1] = a->ne[0];
  tensor->nb[0] = a->nb[1];
  tensor->nb[1] = a->nb[0];
  tensor->op = GGML_OP_TRANSPOSE;
  tensor->src[0] = a;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_transpose(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);
    ggml_format_name(result, "%s (transposed)", a->name);

    result->ne[0] = a->ne[1];
    result->ne[1] = a->ne[0];

    result->nb[0] = a->nb[1];
    result->nb[1] = a->nb[0];

    result->op     = GGML_OP_TRANSPOSE;
    result->src[0] = a;

    return result;
}